

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

void Test25(void)

{
  size_type *psVar1;
  CMOptions Options;
  CMReturn In;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  string in;
  CMReturn res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  ConfusableMatcher matcher;
  string local_2270;
  _CM_RETURN_STATUS local_224c;
  ulong *local_2248;
  long local_2240;
  ulong local_2238;
  undefined4 uStack_2230;
  undefined4 uStack_222c;
  _Alloc_hider local_2228;
  size_type local_2220;
  undefined8 in_stack_ffffffffffffdde8;
  undefined8 in_stack_ffffffffffffddf0;
  long *local_2208;
  long local_2200;
  long local_21f8 [2];
  CMReturn local_21e8;
  undefined8 in_stack_ffffffffffffde30;
  undefined4 uVar8;
  undefined4 uVar9;
  string local_2198;
  string local_2178;
  string local_2158;
  long *local_2138 [2];
  long local_2128 [2];
  string local_2118;
  string local_20f8;
  undefined1 local_20d8;
  undefined7 uStack_20d7;
  undefined1 uStack_20d0;
  undefined7 uStack_20cf;
  undefined1 uStack_20c8;
  undefined7 uStack_20c7;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2090;
  undefined8 local_2078;
  void *pvStack_2070;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2068;
  ConfusableMatcher local_2028;
  
  GetDefaultMap_abi_cxx11_();
  local_2208 = local_21f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2208,
             "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB"
             ,"");
  local_2078 = 0;
  pvStack_2070 = (void *)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20a8,&local_2090);
  local_2068._M_buckets = &local_2068._M_single_bucket;
  local_2068._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2068._M_element_count = 0;
  local_2068._M_bucket_count = 1;
  local_2068._M_rehash_policy._M_max_load_factor = 1.0;
  local_2068._M_rehash_policy._4_4_ = 0;
  local_2068._M_rehash_policy._M_next_resize = 0;
  local_2068._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&local_2028,&local_20a8,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2068,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2068);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20a8);
  local_20f8._M_dataplus._M_p = (pointer)&local_20f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_20f8,local_2208,local_2200 + (long)local_2208);
  local_2118._M_dataplus._M_p = (pointer)&local_2118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2118,"ASB","");
  local_20d8 = 1;
  uStack_20d7 = 0;
  uStack_20d0 = 0;
  uStack_20cf = 0;
  uStack_20c8 = 0;
  uStack_20c7 = 0;
  uStack_20c0 = 1;
  local_20b8 = 0;
  uStack_20b0 = 0;
  ConfusableMatcher::IndexOf
            (&local_21e8,&local_2028,&local_20f8,&local_2118,
             (CMOptions)ZEXT3248(CONCAT824(1,CONCAT816(0,ZEXT816(1)))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2118._M_dataplus._M_p != &local_2118.field_2) {
    operator_delete(local_2118._M_dataplus._M_p,local_2118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20f8._M_dataplus._M_p != &local_20f8.field_2) {
    operator_delete(local_20f8._M_dataplus._M_p,local_20f8.field_2._M_allocated_capacity + 1);
  }
  local_224c = TIMEOUT;
  local_2138[0] = local_2128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2138,"Test25","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_2138);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_2238 = *puVar4;
    uStack_2230 = (undefined4)plVar2[3];
    uStack_222c = *(undefined4 *)((long)plVar2 + 0x1c);
    local_2248 = &local_2238;
  }
  else {
    local_2238 = *puVar4;
    local_2248 = (ulong *)*plVar2;
  }
  local_2240 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_2158._M_dataplus._M_p = (pointer)&local_2158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2158,"TIMEOUT == res.Status","");
  cute::cute_to_string::backslashQuoteTabNewline((string *)&local_2228,&local_2158);
  uVar6 = 0xf;
  if (local_2248 != &local_2238) {
    uVar6 = local_2238;
  }
  if (uVar6 < local_2220 + local_2240) {
    uVar7 = 0xf;
    if (local_2228._M_p != &stack0xffffffffffffdde8) {
      uVar7 = in_stack_ffffffffffffdde8;
    }
    if (local_2220 + local_2240 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2228,0,(char *)0x0,(ulong)local_2248);
      goto LAB_00121b87;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2248,(ulong)local_2228._M_p)
  ;
LAB_00121b87:
  local_2270._M_dataplus._M_p = (pointer)&local_2270.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2270.field_2._M_allocated_capacity = *psVar1;
    local_2270.field_2._8_8_ = puVar3[3];
  }
  else {
    local_2270.field_2._M_allocated_capacity = *psVar1;
    local_2270._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_2270._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_224c,&local_21e8.Status,&local_2270,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x28f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2270._M_dataplus._M_p != &local_2270.field_2) {
    operator_delete(local_2270._M_dataplus._M_p,local_2270.field_2._M_allocated_capacity + 1);
  }
  if (local_2228._M_p != &stack0xffffffffffffdde8) {
    operator_delete(local_2228._M_p,in_stack_ffffffffffffdde8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2158._M_dataplus._M_p != &local_2158.field_2) {
    operator_delete(local_2158._M_dataplus._M_p,local_2158.field_2._M_allocated_capacity + 1);
  }
  if (local_2248 != &local_2238) {
    operator_delete(local_2248,local_2238 + 1);
  }
  if (local_2138[0] != local_2128) {
    operator_delete(local_2138[0],local_2128[0] + 1);
  }
  local_2178._M_dataplus._M_p = (pointer)&local_2178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2178,local_2208,(long)local_2208 + local_2200);
  local_2198._M_dataplus._M_p = (pointer)&local_2198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2198,"ASB","");
  lVar5 = local_2200 + -1;
  uVar9 = 0;
  uVar8 = 1;
  Options.StartIndex = lVar5;
  Options._0_8_ = 1;
  Options._16_4_ = 1;
  Options._20_4_ = 0;
  Options.TimeoutNs = 1;
  Options._32_8_ = local_2078;
  Options.ContainsPosPointers = pvStack_2070;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2270,&local_2028,&local_2178,&local_2198,Options);
  local_21e8._16_8_ = local_2270.field_2._M_allocated_capacity;
  local_21e8.Start = (uint64_t)local_2270._M_dataplus._M_p;
  local_21e8.Size = local_2270._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2198._M_dataplus._M_p != &local_2198.field_2) {
    operator_delete(local_2198._M_dataplus._M_p,local_2198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2178._M_dataplus._M_p != &local_2178.field_2) {
    operator_delete(local_2178._M_dataplus._M_p,local_2178.field_2._M_allocated_capacity + 1);
  }
  In.Size._0_4_ = uVar8;
  In.Start = in_stack_ffffffffffffde30;
  In.Size._4_4_ = uVar9;
  In._16_8_ = lVar5;
  AssertMatch(In,in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
  ConfusableMatcher::~ConfusableMatcher(&local_2028);
  if (local_2208 != local_21f8) {
    operator_delete(local_2208,local_21f8[0] + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2090);
  return;
}

Assistant:

void Test25()
{
	auto map = GetDefaultMap();

	std::string in = "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB";

	CMOptions opts = { };
	opts.MatchRepeating = true;
	opts.StartFromEnd = false;
	opts.TimeoutNs = 1;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "ASB", opts);
	ASSERT_EQUAL(TIMEOUT, res.Status);

	opts.StartFromEnd = true;
	opts.StartIndex = in.size() - 1;
	res = matcher.IndexOf(in, "ASB", opts);
	AssertMatch(res, 92, 3);
}